

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utilities.cpp
# Opt level: O0

string * getFirstToken(string *input)

{
  char *pcVar1;
  ulong in_RSI;
  bool bVar2;
  int i;
  string *input_local;
  string *returnString;
  
  std::__cxx11::string::string((string *)input);
  while( true ) {
    pcVar1 = (char *)std::__cxx11::string::operator[](in_RSI);
    bVar2 = false;
    if (*pcVar1 != ' ') {
      pcVar1 = (char *)std::__cxx11::string::operator[](in_RSI);
      bVar2 = false;
      if (*pcVar1 != '\0') {
        pcVar1 = (char *)std::__cxx11::string::operator[](in_RSI);
        bVar2 = *pcVar1 != '\t';
      }
    }
    if (!bVar2) break;
    pcVar1 = (char *)std::__cxx11::string::operator[](in_RSI);
    std::__cxx11::string::operator+=((string *)input,*pcVar1);
  }
  return input;
}

Assistant:

std::string getFirstToken(std::string input) {
  std::string returnString;
  for(int i = 0; input[i] != ' ' && input[i] != '\0' && input[i] != '\t'; i++) {
    returnString += input[i];
  }
  return returnString;
}